

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flatten.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeFlatten(ConvertLayerParameters layerParameters)

{
  uint uVar1;
  Rep *pRVar2;
  string *psVar3;
  uint uVar4;
  Type *pTVar5;
  uint uVar6;
  Type *pTVar7;
  FlattenLayerParams *this;
  uint uVar8;
  ulong uVar9;
  void **ppvVar10;
  FlattenParameter *pFVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long in_stack_00000008;
  string *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  int *in_stack_00000048;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_e0;
  string local_c0;
  string *local_a0;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Type *local_38;
  
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  local_38 = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                       ((RepeatedPtrFieldBase *)in_stack_00000018,(Type *)0x0);
  if (((pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((pTVar7->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Must have 1 input and 1 output","");
    errorInCaffeProto(&local_e0,(pTVar7->name_).ptr_,(pTVar7->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_a0 = in_stack_00000018;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar7->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  lVar12 = (long)(pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar12 != 0) {
    lVar14 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,*(value_type **)((long)ppvVar10 + lVar14));
      lVar14 = lVar14 + 8;
    } while (lVar12 * 8 != lVar14);
  }
  pRVar2 = (pTVar7->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  lVar12 = (long)(pTVar7->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar12 != 0) {
    lVar14 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,*(value_type **)((long)ppvVar10 + lVar14));
      lVar14 = lVar14 + 8;
    } while (lVar12 * 8 != lVar14);
  }
  convertCaffeMetadata
            ((pTVar7->name_).ptr_,&local_58,&local_78,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_a0,
             in_stack_00000028);
  pFVar11 = pTVar7->flatten_param_;
  if (pFVar11 == (FlattenParameter *)0x0) {
    pFVar11 = (FlattenParameter *)&caffe::_FlattenParameter_default_instance_;
  }
  if (pFVar11->axis_ != 1) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"axis","");
    psVar3 = (pTVar7->name_).ptr_;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Flatten","");
    uVar1 = pFVar11->axis_;
    uVar4 = -uVar1;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    uVar13 = 1;
    if (9 < uVar4) {
      uVar9 = (ulong)uVar4;
      uVar6 = 4;
      do {
        uVar13 = uVar6;
        uVar8 = (uint)uVar9;
        if (uVar8 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_003f9673;
        }
        if (uVar8 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_003f9673;
        }
        if (uVar8 < 10000) goto LAB_003f9673;
        uVar9 = uVar9 / 10000;
        uVar6 = uVar13 + 4;
      } while (99999 < uVar8);
      uVar13 = uVar13 + 1;
    }
LAB_003f9673:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_a0 = psVar3;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar13 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_98._M_dataplus._M_p + (uVar1 >> 0x1f),uVar13,uVar4);
    unsupportedCaffeParrameterWithOption(&local_e0,local_a0,&local_c0,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pFVar11->end_axis_ != -1) && (pFVar11->end_axis_ != 3)) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"end_axis","");
    psVar3 = (pTVar7->name_).ptr_;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Flatten","");
    uVar1 = pFVar11->end_axis_;
    uVar4 = -uVar1;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    uVar13 = 1;
    if (9 < uVar4) {
      uVar9 = (ulong)uVar4;
      uVar6 = 4;
      do {
        uVar13 = uVar6;
        uVar8 = (uint)uVar9;
        if (uVar8 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_003f97d7;
        }
        if (uVar8 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_003f97d7;
        }
        if (uVar8 < 10000) goto LAB_003f97d7;
        uVar9 = uVar9 / 10000;
        uVar6 = uVar13 + 4;
      } while (99999 < uVar8);
      uVar13 = uVar13 + 1;
    }
LAB_003f97d7:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar13 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_98._M_dataplus._M_p + (uVar1 >> 0x1f),uVar13,uVar4);
    unsupportedCaffeParrameterWithOption(&local_e0,psVar3,&local_c0,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  pTVar5 = local_38;
  if (local_38->_oneof_case_[0] != 0x12d) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(local_38);
    pTVar5->_oneof_case_[0] = 0x12d;
    this = (FlattenLayerParams *)operator_new(0x18);
    CoreML::Specification::FlattenLayerParams::FlattenLayerParams(this);
    (pTVar5->layer_).flatten_ = this;
  }
  (((pTVar5->layer_).convolution_)->kernelsize_).current_size_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeFlatten(CoreMLConverter::ConvertLayerParameters layerParameters){
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;

    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::FlattenParameter& caffeLayerParams = caffeLayer.flatten_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis() != 1){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(), "Flatten",std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.end_axis() != -1) {
        if (caffeLayerParams.end_axis() != 3) {
            CoreMLConverter::unsupportedCaffeParrameterWithOption("end_axis", caffeLayer.name(), "Flatten",std::to_string(caffeLayerParams.end_axis()));
        }
    }
    //***************************************************************
    Specification::FlattenLayerParams* flatten_params = specLayer->mutable_flatten();
    flatten_params->set_mode(Specification::FlattenLayerParams::CHANNEL_FIRST);
}